

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdPerform_rec(word t,char *pBuffer,int Pos,int *pVars,int nVars)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint nVars_00;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  word t_00;
  int pVarsNew [6];
  char pNest [10];
  word Cof1 [6];
  word Cof0 [6];
  uint local_e8 [6];
  ulong local_d0;
  char local_c2 [10];
  char *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong auStack_98 [6];
  ulong auStack_68 [7];
  
  if (1999 < Pos) {
    __assert_fail("Pos < DAU_MAX_STR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x2a7,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
  }
  if (nVars < 1) {
    nVars_00 = 0;
  }
  else {
    uVar11 = 0;
    nVars_00 = 0;
    do {
      uVar1 = pVars[uVar11];
      if ((s_Truths6Neg[(int)uVar1] & (t >> ((byte)(1L << ((byte)uVar1 & 0x3f)) & 0x3f) ^ t)) != 0)
      {
        lVar5 = (long)(int)nVars_00;
        nVars_00 = nVars_00 + 1;
        local_e8[lVar5] = uVar1;
      }
      uVar11 = uVar11 + 1;
    } while ((uint)nVars != uVar11);
  }
  if ((int)nVars_00 < 1) {
    __assert_fail("nVarsNew > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x2ad,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
  }
  if (nVars_00 == 1) {
    if (s_Truths6[(int)local_e8[0]] == t) {
      iVar15 = Pos + 1;
      pBuffer[Pos] = (char)local_e8[0] + 'a';
    }
    else {
      if ((s_Truths6[(int)local_e8[0]] ^ t) != 0xffffffffffffffff) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,700,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
      }
      pBuffer[Pos] = '!';
      iVar15 = Pos + 2;
      pBuffer[(long)Pos + 1] = (char)local_e8[0] + 'a';
    }
  }
  else {
    uVar11 = (ulong)nVars_00;
    uVar13 = 0;
    do {
      uVar9 = (ulong)local_e8[uVar13];
      if (5 < uVar9) {
LAB_00500954:
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x337,"word Abc_Tt6Cofactor0(word, int)");
      }
      bVar4 = (byte)local_e8[uVar13];
      bVar2 = (byte)(1L << (bVar4 & 0x3f));
      uVar6 = (s_Truths6Neg[uVar9] & t) << (bVar2 & 0x3f) | s_Truths6Neg[uVar9] & t;
      uVar9 = s_Truths6[uVar9];
      auStack_68[uVar13] = uVar6;
      uVar9 = (uVar9 & t) >> (bVar2 & 0x3f) | uVar9 & t;
      auStack_98[uVar13] = uVar9;
      if (uVar6 == uVar9) {
        __assert_fail("Cof0[v] != Cof1[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x2c4,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
      }
      if (uVar6 == 0xffffffffffffffff) {
        (pBuffer + Pos)[0] = '!';
        (pBuffer + Pos)[1] = '(';
        iVar3 = Pos + 3;
        pBuffer[(long)Pos + 2] = bVar4 + 0x61;
        uVar6 = ~uVar9;
LAB_005006df:
        iVar3 = Dau_DsdPerform_rec(uVar6,pBuffer,iVar3,(int *)local_e8,nVars_00);
        pBuffer[iVar3] = ')';
        return iVar3 + 1;
      }
      if (uVar6 == 0) {
        pBuffer[Pos] = '(';
        iVar3 = Pos + 2;
        pBuffer[(long)Pos + 1] = bVar4 + 0x61;
        uVar6 = uVar9;
        goto LAB_005006df;
      }
      if (uVar9 == 0xffffffffffffffff) {
        (pBuffer + Pos)[0] = '!';
        (pBuffer + Pos)[1] = '(';
        pBuffer[(long)Pos + 2] = '!';
        iVar3 = Pos + 4;
        pBuffer[(long)Pos + 3] = bVar4 + 0x61;
        uVar6 = ~uVar6;
        goto LAB_005006df;
      }
      if (uVar9 == 0) {
        (pBuffer + Pos)[0] = '(';
        (pBuffer + Pos)[1] = '!';
        iVar3 = Pos + 3;
        pBuffer[(long)Pos + 2] = bVar4 + 0x61;
        goto LAB_005006df;
      }
      if ((uVar9 ^ uVar6) == 0xffffffffffffffff) {
        pBuffer[Pos] = '[';
        pBuffer[(long)Pos + 1] = bVar4 + 0x61;
        iVar3 = Dau_DsdPerform_rec(uVar6,pBuffer,Pos + 2,(int *)local_e8,nVars_00);
        pBuffer[iVar3] = ']';
        return iVar3 + 1;
      }
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
    local_b0 = 1;
    if (1 < (int)nVars_00) {
      local_b0 = (ulong)nVars_00;
    }
    uVar9 = 1;
    local_b8 = pBuffer;
    uVar13 = 0;
    do {
      local_a0 = uVar13 + 1;
      local_a8 = uVar9;
      uVar6 = uVar9;
      if (local_a0 < uVar11) {
        do {
          uVar1 = local_e8[uVar6];
          uVar7 = (ulong)uVar1;
          if (5 < uVar7) goto LAB_00500954;
          uVar12 = s_Truths6Neg[uVar7] & auStack_68[uVar13];
          bVar2 = (byte)(1L << ((byte)uVar1 & 0x3f));
          local_d0 = uVar7;
          uVar14 = auStack_68[uVar13] & s_Truths6[uVar7];
          uVar10 = s_Truths6Neg[uVar7] & auStack_98[uVar13];
          uVar12 = uVar12 << (bVar2 & 0x3f) | uVar12;
          uVar8 = auStack_98[uVar13] & s_Truths6[uVar7];
          uVar14 = uVar14 >> (bVar2 & 0x3f) | uVar14;
          uVar10 = uVar10 << (bVar2 & 0x3f) | uVar10;
          uVar8 = uVar8 >> (bVar2 & 0x3f) | uVar8;
          if ((uVar12 == uVar14) && (uVar12 == uVar10)) {
            sprintf(local_c2,"(%c%c)",(ulong)(local_e8[uVar13] + 0x61),(ulong)(uVar1 + 0x61));
            pBuffer = local_b8;
            iVar3 = Dau_DsdPerform_rec((uVar8 ^ uVar12) & s_Truths6[uVar7] ^ uVar12,local_b8,Pos,
                                       (int *)local_e8,nVars_00);
            goto LAB_00500947;
          }
          if ((uVar12 == uVar14) && (uVar12 == uVar8)) {
            sprintf(local_c2,"(%c!%c)",(ulong)(local_e8[uVar13] + 0x61),(ulong)(uVar1 + 0x61));
            pBuffer = local_b8;
            iVar3 = Dau_DsdPerform_rec((uVar10 ^ uVar12) & s_Truths6[uVar7] ^ uVar12,local_b8,Pos,
                                       (int *)local_e8,nVars_00);
            goto LAB_00500947;
          }
          if ((uVar12 == uVar10) && (uVar12 == uVar8)) {
            sprintf(local_c2,"(!%c%c)",(ulong)(local_e8[uVar13] + 0x61),(ulong)(uVar1 + 0x61));
            pBuffer = local_b8;
            iVar3 = Dau_DsdPerform_rec((uVar14 ^ uVar12) & s_Truths6[uVar7] ^ uVar12,local_b8,Pos,
                                       (int *)local_e8,nVars_00);
            goto LAB_00500947;
          }
          if ((uVar14 == uVar10) && (uVar14 == uVar8)) {
            sprintf(local_c2,"(!%c!%c)",(ulong)(local_e8[uVar13] + 0x61),(ulong)(uVar1 + 0x61));
            t_00 = (uVar12 ^ uVar14) & s_Truths6[uVar7] ^ uVar14;
LAB_00500925:
            iVar3 = Dau_DsdPerform_rec(t_00,pBuffer,Pos,(int *)local_e8,nVars_00);
LAB_00500947:
            iVar3 = Dau_DsdPerformReplace(pBuffer,Pos,iVar3,uVar1 + 0x61,local_c2);
            return iVar3;
          }
          if ((uVar12 == uVar8) && (uVar14 == uVar10)) {
            sprintf(local_c2,"[%c%c]",(ulong)(local_e8[uVar13] + 0x61),(ulong)(uVar1 + 0x61));
            t_00 = (uVar14 ^ uVar12) & s_Truths6[uVar7] ^ uVar12;
            goto LAB_00500925;
          }
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
      }
      uVar9 = uVar9 + 1;
      uVar13 = local_a0;
    } while (local_a0 != local_b0);
    uVar11 = 1;
    if (1 < (int)nVars_00) {
      uVar11 = (ulong)nVars_00;
    }
    uVar13 = 0xffffffff;
    iVar3 = 10;
    uVar9 = 0;
    do {
      uVar6 = 0;
      iVar15 = 0;
      do {
        if (uVar9 != uVar6) {
          bVar2 = (byte)(1L << ((byte)local_e8[uVar6] & 0x3f));
          if (((auStack_68[uVar9] >> (bVar2 & 0x3f) ^ auStack_68[uVar9]) &
              s_Truths6Neg[(int)local_e8[uVar6]]) != 0) {
            iVar15 = (iVar15 + 1) -
                     (uint)(((auStack_98[uVar9] >> (bVar2 & 0x3f) ^ auStack_98[uVar9]) &
                            s_Truths6Neg[(int)local_e8[uVar6]]) == 0);
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar11 != uVar6);
      if (iVar15 < iVar3) {
        uVar13 = uVar9 & 0xffffffff;
      }
      if (iVar15 == 0) break;
      if (iVar15 <= iVar3) {
        iVar3 = iVar15;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar11);
    pBuffer[Pos] = '<';
    iVar15 = (int)uVar13;
    pBuffer[(long)Pos + 1] = (char)local_e8[iVar15] + 'a';
    iVar3 = Dau_DsdPerform_rec(auStack_98[iVar15],pBuffer,Pos + 2,(int *)local_e8,nVars_00);
    iVar3 = Dau_DsdPerform_rec(auStack_68[iVar15],pBuffer,iVar3,(int *)local_e8,nVars_00);
    iVar15 = iVar3 + 1;
    pBuffer[iVar3] = '>';
  }
  return iVar15;
}

Assistant:

int Dau_DsdPerform_rec( word t, char * pBuffer, int Pos, int * pVars, int nVars )
{
    char pNest[10];
    word Cof0[6], Cof1[6], Cof[4];
    int pVarsNew[6], nVarsNew, PosStart;
    int v, u, vBest, CountBest;
    assert( Pos < DAU_MAX_STR );
    // perform support minimization
    nVarsNew = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Abc_Tt6HasVar( t, pVars[v] ) )
            pVarsNew[ nVarsNew++ ] = pVars[v];
    assert( nVarsNew > 0 );
    // special case when function is a var
    if ( nVarsNew == 1 )
    {
        if ( t == s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        if ( t == ~s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        assert( 0 );
        return Pos;
    }
    // decompose on the output side
    for ( v = 0; v < nVarsNew; v++ )
    {
        Cof0[v] = Abc_Tt6Cofactor0( t, pVarsNew[v] );
        Cof1[v] = Abc_Tt6Cofactor1( t, pVarsNew[v] );
        assert( Cof0[v] != Cof1[v] );
        if ( Cof0[v] == 0 ) // ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~(word)0 ) // !(ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == 0 ) // !ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == ~(word)0 ) // !(!ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~Cof1[v] ) // a^x
        {
            pBuffer[Pos++] = '[';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ']';
            return Pos;
        }
    }
    // decompose on the input side
    for ( v = 0; v < nVarsNew; v++ )
    for ( u = v+1; u < nVarsNew; u++ )
    {
        Cof[0] = Abc_Tt6Cofactor0( Cof0[v], pVarsNew[u] );
        Cof[1] = Abc_Tt6Cofactor1( Cof0[v], pVarsNew[u] );
        Cof[2] = Abc_Tt6Cofactor0( Cof1[v], pVarsNew[u] );
        Cof[3] = Abc_Tt6Cofactor1( Cof1[v], pVarsNew[u] );
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[2] ) // vu
        {
            PosStart = Pos;
            sprintf( pNest, "(%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[3]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[3] ) // v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[2]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[2] && Cof[0] == Cof[3] ) // !vu
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[1] == Cof[2] && Cof[1] == Cof[3] ) // !v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[0]) | (~s_Truths6[pVarsNew[u]] & Cof[1]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[3] && Cof[1] == Cof[2] ) // v+u
        {
            PosStart = Pos;
            sprintf( pNest, "[%c%c]", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
    } 
    // find best variable for MUX decomposition
    vBest = -1;
    CountBest = 10;
    for ( v = 0; v < nVarsNew; v++ )
    {
        int CountCur = 0;
        for ( u = 0; u < nVarsNew; u++ )
            if ( u != v && Abc_Tt6HasVar(Cof0[v], pVarsNew[u]) && Abc_Tt6HasVar(Cof1[v], pVarsNew[u]) )
                CountCur++;
        if ( CountBest > CountCur )
        {
            CountBest = CountCur;
            vBest = v;
        }
        if ( CountCur == 0 )
            break;
    }
    // perform MUX decomposition
    pBuffer[Pos++] = '<';
    pBuffer[Pos++] = 'a' + pVarsNew[vBest];
    Pos = Dau_DsdPerform_rec( Cof1[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    Pos = Dau_DsdPerform_rec( Cof0[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    pBuffer[Pos++] = '>';
    return Pos;
}